

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,detail *this,bool pure)

{
  undefined7 in_register_00000011;
  detail local_a;
  detail local_9;
  
  if ((int)this == 0) {
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::independent_end_matcher>
              (__return_storage_ptr__,&local_a,
               (independent_end_matcher *)CONCAT71(in_register_00000011,pure));
  }
  else {
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::true_matcher>
              (__return_storage_ptr__,&local_9,(true_matcher *)CONCAT71(in_register_00000011,pure));
  }
  return __return_storage_ptr__;
}

Assistant:

inline sequence<BidiIter> make_independent_end_xpression(bool pure)
{
    if(pure)
    {
        return detail::make_dynamic<BidiIter>(detail::true_matcher());
    }
    else
    {
        return detail::make_dynamic<BidiIter>(detail::independent_end_matcher());
    }
}